

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Errors.h
# Opt level: O1

CompileMessage * __thiscall
soul::CompileMessageHelpers::createMessage<std::__cxx11::string&,std::__cxx11::string_const&>
          (CompileMessage *__return_storage_ptr__,CompileMessageHelpers *this,Category category,
          Type type,char *text,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  SourceCodeText *local_18;
  undefined8 uStack_10;
  
  local_18 = (SourceCodeText *)0x0;
  uStack_10 = 0;
  createMessage<std::__cxx11::string&,std::__cxx11::string_const&>
            (__return_storage_ptr__,this,(Category)&local_18,(CodeLocation *)(ulong)category,type,
             text,args,in_stack_ffffffffffffffe0);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_18);
  return __return_storage_ptr__;
}

Assistant:

static CompileMessage createMessage (CompileMessage::Category category, CompileMessage::Type type,
                                         const char* text, Args&&... args)
    {
        return createMessage (category, CodeLocation(), type, text, std::forward<Args> (args)...);
    }